

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad_gl.c
# Opt level: O0

void glad_gl_load_GL_VERSION_1_1(GLADuserptrloadfunc load,void *userptr)

{
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  if (GLAD_GL_VERSION_1_1 != 0) {
    glad_glAreTexturesResident =
         (PFNGLARETEXTURESRESIDENTPROC)(*load)("glAreTexturesResident",userptr);
    glad_glArrayElement = (PFNGLARRAYELEMENTPROC)(*load)("glArrayElement",userptr);
    glad_glBindTexture = (PFNGLBINDTEXTUREPROC)(*load)("glBindTexture",userptr);
    glad_glColorPointer = (PFNGLCOLORPOINTERPROC)(*load)("glColorPointer",userptr);
    glad_glCopyTexImage1D = (PFNGLCOPYTEXIMAGE1DPROC)(*load)("glCopyTexImage1D",userptr);
    glad_glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC)(*load)("glCopyTexImage2D",userptr);
    glad_glCopyTexSubImage1D = (PFNGLCOPYTEXSUBIMAGE1DPROC)(*load)("glCopyTexSubImage1D",userptr);
    glad_glCopyTexSubImage2D = (PFNGLCOPYTEXSUBIMAGE2DPROC)(*load)("glCopyTexSubImage2D",userptr);
    glad_glDeleteTextures = (PFNGLDELETETEXTURESPROC)(*load)("glDeleteTextures",userptr);
    glad_glDisableClientState = (PFNGLDISABLECLIENTSTATEPROC)(*load)("glDisableClientState",userptr)
    ;
    glad_glDrawArrays = (PFNGLDRAWARRAYSPROC)(*load)("glDrawArrays",userptr);
    glad_glDrawElements = (PFNGLDRAWELEMENTSPROC)(*load)("glDrawElements",userptr);
    glad_glEdgeFlagPointer = (PFNGLEDGEFLAGPOINTERPROC)(*load)("glEdgeFlagPointer",userptr);
    glad_glEnableClientState = (PFNGLENABLECLIENTSTATEPROC)(*load)("glEnableClientState",userptr);
    glad_glGenTextures = (PFNGLGENTEXTURESPROC)(*load)("glGenTextures",userptr);
    glad_glGetPointerv = (PFNGLGETPOINTERVPROC)(*load)("glGetPointerv",userptr);
    glad_glIndexPointer = (PFNGLINDEXPOINTERPROC)(*load)("glIndexPointer",userptr);
    glad_glIndexub = (PFNGLINDEXUBPROC)(*load)("glIndexub",userptr);
    glad_glIndexubv = (PFNGLINDEXUBVPROC)(*load)("glIndexubv",userptr);
    glad_glInterleavedArrays = (PFNGLINTERLEAVEDARRAYSPROC)(*load)("glInterleavedArrays",userptr);
    glad_glIsTexture = (PFNGLISTEXTUREPROC)(*load)("glIsTexture",userptr);
    glad_glNormalPointer = (PFNGLNORMALPOINTERPROC)(*load)("glNormalPointer",userptr);
    glad_glPolygonOffset = (PFNGLPOLYGONOFFSETPROC)(*load)("glPolygonOffset",userptr);
    glad_glPopClientAttrib = (*load)("glPopClientAttrib",userptr);
    glad_glPrioritizeTextures = (PFNGLPRIORITIZETEXTURESPROC)(*load)("glPrioritizeTextures",userptr)
    ;
    glad_glPushClientAttrib = (PFNGLPUSHCLIENTATTRIBPROC)(*load)("glPushClientAttrib",userptr);
    glad_glTexCoordPointer = (PFNGLTEXCOORDPOINTERPROC)(*load)("glTexCoordPointer",userptr);
    glad_glTexSubImage1D = (PFNGLTEXSUBIMAGE1DPROC)(*load)("glTexSubImage1D",userptr);
    glad_glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)(*load)("glTexSubImage2D",userptr);
    glad_glVertexPointer = (PFNGLVERTEXPOINTERPROC)(*load)("glVertexPointer",userptr);
  }
  return;
}

Assistant:

static void glad_gl_load_GL_VERSION_1_1( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_VERSION_1_1) return;
    glAreTexturesResident = (PFNGLARETEXTURESRESIDENTPROC) load("glAreTexturesResident", userptr);
    glArrayElement = (PFNGLARRAYELEMENTPROC) load("glArrayElement", userptr);
    glBindTexture = (PFNGLBINDTEXTUREPROC) load("glBindTexture", userptr);
    glColorPointer = (PFNGLCOLORPOINTERPROC) load("glColorPointer", userptr);
    glCopyTexImage1D = (PFNGLCOPYTEXIMAGE1DPROC) load("glCopyTexImage1D", userptr);
    glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC) load("glCopyTexImage2D", userptr);
    glCopyTexSubImage1D = (PFNGLCOPYTEXSUBIMAGE1DPROC) load("glCopyTexSubImage1D", userptr);
    glCopyTexSubImage2D = (PFNGLCOPYTEXSUBIMAGE2DPROC) load("glCopyTexSubImage2D", userptr);
    glDeleteTextures = (PFNGLDELETETEXTURESPROC) load("glDeleteTextures", userptr);
    glDisableClientState = (PFNGLDISABLECLIENTSTATEPROC) load("glDisableClientState", userptr);
    glDrawArrays = (PFNGLDRAWARRAYSPROC) load("glDrawArrays", userptr);
    glDrawElements = (PFNGLDRAWELEMENTSPROC) load("glDrawElements", userptr);
    glEdgeFlagPointer = (PFNGLEDGEFLAGPOINTERPROC) load("glEdgeFlagPointer", userptr);
    glEnableClientState = (PFNGLENABLECLIENTSTATEPROC) load("glEnableClientState", userptr);
    glGenTextures = (PFNGLGENTEXTURESPROC) load("glGenTextures", userptr);
    glGetPointerv = (PFNGLGETPOINTERVPROC) load("glGetPointerv", userptr);
    glIndexPointer = (PFNGLINDEXPOINTERPROC) load("glIndexPointer", userptr);
    glIndexub = (PFNGLINDEXUBPROC) load("glIndexub", userptr);
    glIndexubv = (PFNGLINDEXUBVPROC) load("glIndexubv", userptr);
    glInterleavedArrays = (PFNGLINTERLEAVEDARRAYSPROC) load("glInterleavedArrays", userptr);
    glIsTexture = (PFNGLISTEXTUREPROC) load("glIsTexture", userptr);
    glNormalPointer = (PFNGLNORMALPOINTERPROC) load("glNormalPointer", userptr);
    glPolygonOffset = (PFNGLPOLYGONOFFSETPROC) load("glPolygonOffset", userptr);
    glPopClientAttrib = (PFNGLPOPCLIENTATTRIBPROC) load("glPopClientAttrib", userptr);
    glPrioritizeTextures = (PFNGLPRIORITIZETEXTURESPROC) load("glPrioritizeTextures", userptr);
    glPushClientAttrib = (PFNGLPUSHCLIENTATTRIBPROC) load("glPushClientAttrib", userptr);
    glTexCoordPointer = (PFNGLTEXCOORDPOINTERPROC) load("glTexCoordPointer", userptr);
    glTexSubImage1D = (PFNGLTEXSUBIMAGE1DPROC) load("glTexSubImage1D", userptr);
    glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC) load("glTexSubImage2D", userptr);
    glVertexPointer = (PFNGLVERTEXPOINTERPROC) load("glVertexPointer", userptr);
}